

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader capnp::_::WireHelpers::readDataPointer
                 (SegmentReader *segment,WirePointer *ref,word *refTarget,void *defaultValue,
                 BlobSize defaultSize)

{
  word *pwVar1;
  byte *value;
  WirePointer *segment_00;
  bool bVar2;
  ElementSize EVar3;
  uint uVar4;
  Kind KVar5;
  WordCount size_00;
  Fault local_88;
  Fault f_2;
  Fault f_1;
  Fault local_68;
  Fault f;
  Maybe<const_capnp::word_&> MStack_58;
  uint size;
  word *local_50;
  word *p;
  word *ptr;
  byte *pbStack_38;
  BlobSize defaultSize_local;
  void *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  SegmentReader *segment_local;
  
  ptr._4_4_ = defaultSize;
  pbStack_38 = (byte *)defaultValue;
  defaultValue_local = refTarget;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)segment;
  bVar2 = WirePointer::isNull(ref);
  if (!bVar2) {
    MStack_58 = followFars((WirePointer **)&refTarget_local,(word *)defaultValue_local,
                           (SegmentReader **)&ref_local);
    local_50 = kj::_::readMaybe<capnp::word_const>(&stack0xffffffffffffffa8);
    if ((local_50 != (word *)0x0) && (p = local_50, local_50 != (word *)0x0)) {
      f.exception._4_4_ =
           WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
      KVar5 = WirePointer::kind((WirePointer *)refTarget_local);
      if (KVar5 == LIST) {
        EVar3 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
        segment_00 = ref_local;
        pwVar1 = p;
        if (EVar3 == BYTE) {
          size_00 = roundBytesUpToWords(f.exception._4_4_);
          bVar2 = boundsCheck((SegmentReader *)segment_00,pwVar1,size_00);
          pwVar1 = p;
          if (bVar2) {
            uVar4 = unbound<unsigned_int>(f.exception._4_4_);
            Data::Reader::Reader((Reader *)&segment_local,(byte *)pwVar1,(ulong)uVar4);
            return (Reader)_segment_local;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    (&local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9c0,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "\"Message contained out-of-bounds data pointer.\"",
                     (char (*) [46])"Message contained out-of-bounds data pointer.");
          kj::_::Debug::Fault::~Fault(&local_88);
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9bb,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "\"Message contains list pointer of non-bytes where data was expected.\"",
                     (char (*) [68])
                     "Message contains list pointer of non-bytes where data was expected.");
          kj::_::Debug::Fault::~Fault(&f_2);
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[59]>
                  (&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9b6,FAILED,"ref->kind() == WirePointer::LIST",
                   "\"Message contains non-list pointer where data was expected.\"",
                   (char (*) [59])"Message contains non-list pointer where data was expected.");
        kj::_::Debug::Fault::~Fault(&local_68);
      }
    }
  }
  value = pbStack_38;
  uVar4 = unbound<unsigned_int>(ptr._4_4_);
  Data::Reader::Reader((Reader *)&segment_local,value,(ulong)uVar4);
  return (Reader)_segment_local;
}

Assistant:

static KJ_ALWAYS_INLINE(Data::Reader readDataPointer(
      SegmentReader* segment, const WirePointer* ref, const word* refTarget,
      const void* defaultValue, BlobSize defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      return Data::Reader(reinterpret_cast<const byte*>(defaultValue),
          unbound(defaultSize / BYTES));
    } else {
      const word* ptr;
      KJ_IF_MAYBE(p, followFars(ref, refTarget, segment)) {
        ptr = p;
      } else {
        goto useDefault;
      }

      if (KJ_UNLIKELY(ptr == nullptr)) {
        // Already reported error.
        goto useDefault;
      }

      auto size = ref->listRef.elementCount() * (ONE * BYTES / ELEMENTS);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
                 "Message contains non-list pointer where data was expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
                 "Message contains list pointer of non-bytes where data was expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(boundsCheck(segment, ptr, roundBytesUpToWords(size)),
                 "Message contained out-of-bounds data pointer.") {
        goto useDefault;
      }

      return Data::Reader(reinterpret_cast<const byte*>(ptr), unbound(size / BYTES));
    }
  }